

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

void __thiscall FSerializer::Close(FSerializer *this)

{
  uint uVar1;
  FWriter *this_00;
  FReader *pFVar2;
  DObject **ppDVar3;
  DThinker *pDVar4;
  long lVar5;
  
  this_00 = this->w;
  if (this_00 != (FWriter *)0x0) {
    FWriter::~FWriter(this_00);
    operator_delete(this_00,0x78);
    this->w = (FWriter *)0x0;
  }
  pFVar2 = this->r;
  if (pFVar2 != (FReader *)0x0) {
    ppDVar3 = (pFVar2->mDObjects).Array;
    uVar1 = (pFVar2->mDObjects).Count;
    for (lVar5 = 0; (ulong)uVar1 << 3 != lVar5; lVar5 = lVar5 + 8) {
      pDVar4 = dyn_cast<DThinker>(*(DObject **)((long)ppDVar3 + lVar5));
      if ((pDVar4 != (DThinker *)0x0) &&
         ((pDVar4->NextThinker == (DThinker *)0x0 || (pDVar4->PrevThinker == (DThinker *)0x0)))) {
        (*(pDVar4->super_DObject)._vptr_DObject[4])(pDVar4);
      }
    }
    pFVar2 = this->r;
    if (pFVar2 != (FReader *)0x0) {
      FReader::~FReader(pFVar2);
    }
    operator_delete(pFVar2,0xb8);
    this->r = (FReader *)0x0;
  }
  if (0 < this->mErrors) {
    I_Error("%d errors parsing JSON");
    return;
  }
  return;
}

Assistant:

void FSerializer::Close()
{	
	if (w != nullptr)
	{
		delete w;
		w = nullptr;
	}
	if (r != nullptr)
	{
		// we must explicitly delete all thinkers in the array which did not get linked into the thinker lists.
		// Otherwise these objects may survive a level deletion and point to incorrect data.
		for (auto &obj : r->mDObjects)
		{
			auto think = dyn_cast<DThinker>(obj);
			if (think != nullptr)
			{
				if (think->NextThinker == nullptr || think->PrevThinker == nullptr)
				{
					think->Destroy();
				}
			}
		}

		delete r;
		r = nullptr;
	}
	if (mErrors > 0)
	{
		I_Error("%d errors parsing JSON", mErrors);
	}
}